

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O0

void __thiscall SM83::xor_dhl(SM83 *this)

{
  byte bVar1;
  format_string<unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&,_unsigned_short_&>
  fmt;
  undefined4 in_stack_ffffffffffffffc8;
  byte bVar2;
  undefined4 in_stack_ffffffffffffffcc;
  u8 result;
  SM83 *this_local;
  
  fmt.str_.size_ = (size_t)this;
  fmt.str_.data_ = (char *)0x46;
  ::fmt::v11::
  print<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&>
            ((v11 *)"AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  XOR (HL)\n",fmt,
             &(this->field_1).bc,&(this->field_2).de,&(this->field_3).hl,&this->sp,
             &this->pc_at_opcode,
             (unsigned_short *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  bVar2 = (this->field_0).field_1.a;
  bVar1 = Bus::Read8(this->bus,(this->field_3).hl,true);
  SetZeroFlag(this,(bVar2 ^ bVar1) == 0);
  SetNegateFlag(this,false);
  SetHalfCarryFlag(this,false);
  SetCarryFlag(this,false);
  (this->field_0).field_1.a = bVar2 ^ bVar1;
  return;
}

Assistant:

void SM83::xor_dhl() {
    LTRACE("XOR (HL)");

    u8 result = a ^ bus.Read8(hl);

    SetZeroFlag(result == 0);
    SetNegateFlag(false);
    SetHalfCarryFlag(false);
    SetCarryFlag(false);

    a = result;
}